

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O0

uint32_t day14a::get_index(string *input,int stretch)

{
  char needle;
  char cVar1;
  reference pvVar2;
  value_type *hc_1;
  int j;
  char c;
  value_type *hc;
  uint32_t local_50;
  int found;
  int i;
  allocator<day14a::MD5Cache> local_39;
  undefined1 local_38 [8];
  vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> hash_cache;
  char *key;
  int stretch_local;
  string *input_local;
  
  hash_cache.super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::c_str();
  std::allocator<day14a::MD5Cache>::allocator(&local_39);
  std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::vector
            ((vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> *)local_38,1000,&local_39)
  ;
  std::allocator<day14a::MD5Cache>::~allocator(&local_39);
  pvVar2 = std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::operator[]
                     ((vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> *)local_38,0);
  pvVar2->index = -1;
  local_50 = 0;
  hc._4_4_ = 0;
  do {
    pvVar2 = std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::operator[]
                       ((vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> *)local_38,
                        (long)((int)local_50 % 1000));
    if (pvVar2->index != local_50) {
      hash_and_stretch((char *)hash_cache.
                               super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50,stretch,
                       pvVar2);
    }
    needle = find_sequence<3>(pvVar2->md5,'\0');
    hc_1._0_4_ = local_50;
    if (needle != '\0') {
      do {
        hc_1._0_4_ = (uint32_t)hc_1 + 1;
        if ((int)(local_50 + 1000) < (int)(uint32_t)hc_1) goto LAB_0012f4e6;
        pvVar2 = std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::operator[]
                           ((vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> *)local_38,
                            (long)((int)(uint32_t)hc_1 % 1000));
        if (pvVar2->index != (uint32_t)hc_1) {
          hash_and_stretch((char *)hash_cache.
                                   super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint32_t)hc_1
                           ,stretch,pvVar2);
        }
        cVar1 = find_sequence<5>(pvVar2->md5,needle);
      } while (cVar1 == '\0');
      hc._4_4_ = hc._4_4_ + 1;
      if (hc._4_4_ == 0x40) {
        std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::~vector
                  ((vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> *)local_38);
        return local_50;
      }
    }
LAB_0012f4e6:
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

uint32_t get_index(const std::string& input, int stretch) {
		const char* key = input.c_str();
		std::vector<MD5Cache> hash_cache(1000);
		hash_cache[0].index = -1;
		for(int i = 0, found = 0;; ++i) {
			auto& hc = hash_cache[i % 1000];
			if(hc.index != i) {
				hash_and_stretch(key, i, stretch, hc);
			}
			char c = find_sequence<3>(hc.md5, 0);
			if(c != 0) {
				for(int j = i + 1; j <= i + 1000; ++j) {
					auto& hc = hash_cache[j % 1000];
					if(hc.index != j) {
						hash_and_stretch(key, j, stretch, hc);
					}
					if(find_sequence<5>(hc.md5, c)) {
						if(++found == 64) {
							return i;
						}
						break;
					}
				}
			}
		}
		return 0;
	}